

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O2

void __thiscall
nigel::IMC_Generator::generateMoveA
          (IMC_Generator *this,OperationType ot,shared_ptr<nigel::IM_Operator> *op)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 local_e8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (ot == c) {
    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,&op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
    local_e8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_a_const,(shared_ptr<nigel::IM_Operator> *)&local_88,
           (shared_ptr<nigel::IM_Operator> *)(local_e8 + 0x10));
    this_00 = &local_88._M_refcount;
    this_01 = &_Stack_d0;
  }
  else {
    if (ot != v) {
      return;
    }
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_e8);
    iVar1 = *(int *)(local_e8._0_8_ + 0x1c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
    if (iVar1 == 0) {
      this_00 = &local_30._M_refcount;
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_30,&op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
      local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)&local_30,&local_98);
      this_01 = &local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_e8);
      iVar1 = *(int *)(local_e8._0_8_ + 0x1c);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
      if (iVar1 == 1) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_68,&op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                  );
        local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_68,&local_a8);
        this_00 = &local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
        local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_48,&local_b8);
        this_01 = &local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_e8);
        iVar1 = *(int *)(local_e8._0_8_ + 0x1c);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_78,&op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                  );
        generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_78);
        this_00 = &local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
        local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_58,&local_c8);
        this_01 = &local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return;
}

Assistant:

void IMC_Generator::generateMoveA( OperationType ot, std::shared_ptr<IM_Operator> op )
	{
		if( ot == OT::v )
		{
			if( op->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, op );
			}
			else if( op->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, op );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( op->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( op );
				addCmd( HexOp::mov_a_atr0 );
			}
		}
		else if( ot == OT::c )
		{
			addCmd( HexOp::mov_a_const, op );
		}
		//Ignore OT::t because it is already correct.
	}